

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::goToBase(UEFITool *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  QFlags<QItemSelectionModel::SelectionFlag> local_38;
  Int local_34;
  undefined1 local_30 [8];
  QModelIndex index;
  UINT32 offset;
  UEFITool *this_local;
  
  QWidget::setFocus((QWidget *)(this->goToBaseDialog->ui->super_Ui_GoToBaseDialog).hexSpinBox);
  QAbstractSpinBox::selectAll();
  iVar2 = (**(code **)(*(long *)this->goToBaseDialog + 0x1a8))();
  if (iVar2 == 1) {
    index.m._4_4_ = QSpinBox::value();
    TreeModel::findByBase((QModelIndex *)local_30,this->model,index.m._4_4_);
    bVar1 = QModelIndex::isValid((QModelIndex *)local_30);
    if (bVar1) {
      (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))(*(long **)(this->ui + 0x130),local_30,3);
      plVar3 = (long *)QAbstractItemView::selectionModel();
      local_38 = operator|(Select,Rows);
      local_34 = (Int)QFlags<QItemSelectionModel::SelectionFlag>::operator|(&local_38,Clear);
      (**(code **)(*plVar3 + 0x68))(plVar3,local_30,local_34);
    }
  }
  return;
}

Assistant:

void UEFITool::goToBase()
{
    goToBaseDialog->ui->hexSpinBox->setFocus();
    goToBaseDialog->ui->hexSpinBox->selectAll();
    if (goToBaseDialog->exec() != QDialog::Accepted)
        return;
    
    UINT32 offset = (UINT32)goToBaseDialog->ui->hexSpinBox->value();
    QModelIndex index = model->findByBase(offset);
    if (index.isValid()) {
        ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
        ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
    }
}